

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

void __thiscall SVGChart::PPlot::PPlot(PPlot *this)

{
  PPlot *this_local;
  
  PDrawer::PDrawer(&this->super_PDrawer);
  (this->super_PDrawer)._vptr_PDrawer = (_func_int **)&PTR__PPlot_001245f0;
  PlotDataContainer::PlotDataContainer(&this->mPlotDataContainer);
  AxisSetup::AxisSetup(&this->mXAxisSetup);
  AxisSetup::AxisSetup(&this->mYAxisSetup);
  GridInfo::GridInfo(&this->mGridInfo,false,false);
  PMargins::PMargins(&this->mMargins);
  PlotBackground::PlotBackground(&this->mPlotBackground);
  this->mHasAnyModifyingCalculatorBeenActive = false;
  std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>::vector
            (&this->mModifyingCalculatorList);
  std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>::vector
            (&this->mPostCalculatorList);
  std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>::vector
            (&this->mPreDrawerList);
  std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>::vector
            (&this->mPostDrawerList);
  this->mXTickIterator = &(this->mXLinTickIterator).super_TickIterator;
  this->mYTickIterator = &(this->mYLinTickIterator).super_TickIterator;
  this->mXTrafo = &(this->mXLinTrafo).super_Trafo;
  this->mYTrafo = &(this->mYLinTrafo).super_Trafo;
  LinTrafo::LinTrafo(&this->mXLinTrafo);
  LinTrafo::LinTrafo(&this->mYLinTrafo);
  LogTrafo::LogTrafo(&this->mXLogTrafo);
  LogTrafo::LogTrafo(&this->mYLogTrafo);
  LinTickIterator::LinTickIterator(&this->mXLinTickIterator);
  LinTickIterator::LinTickIterator(&this->mYLinTickIterator);
  LogTickIterator::LogTickIterator(&this->mXLogTickIterator);
  LogTickIterator::LogTickIterator(&this->mYLogTickIterator);
  NamedTickIterator::NamedTickIterator(&this->mXNamedTickIterator);
  this->mPPlotDrawer = (PDrawer *)0x0;
  this->mOwnsPPlotDrawer = true;
  (this->mMargins).mLeft = kDefaultMargins;
  (this->mMargins).mRight = DAT_00125248;
  (this->mMargins).mTop = DAT_00125250;
  (this->mMargins).mBottom = DAT_00125258;
  (this->mYAxisSetup).mAscending = false;
  return;
}

Assistant:

PPlot::PPlot ():
      mHasAnyModifyingCalculatorBeenActive (false),
      mXTickIterator (&mXLinTickIterator),
      mYTickIterator (&mYLinTickIterator),
      mXTrafo (&mXLinTrafo),
      mYTrafo (&mYLinTrafo),
      mOwnsPPlotDrawer (true)
    
    {
       mMargins = kDefaultMargins;
       mYAxisSetup.mAscending = false;
    }